

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float16 float16_sub_ppc(float16 a,float16 b,float_status *status)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  FloatParts FVar4;
  FloatClass FVar5;
  float16 fVar6;
  uint64_t a_00;
  FloatClass FVar7;
  int iVar8;
  ulong uVar10;
  byte bVar11;
  int count;
  ulong uVar12;
  int iVar13;
  FloatParts FVar14;
  FloatParts local_50;
  FloatParts local_40;
  ulong uVar9;
  
  FVar14 = float16a_unpack_canonical(a,status,&float16_params);
  auVar3 = FVar14._0_12_;
  uVar9 = FVar14._8_8_;
  uVar12 = FVar14.frac;
  local_40 = float16a_unpack_canonical(b,status,&float16_params);
  uVar10 = local_40._8_8_;
  a_00 = local_40.frac;
  bVar11 = FVar14.sign;
  FVar5 = local_40.cls;
  iVar8 = local_40.exp;
  FVar7 = FVar14.cls;
  iVar13 = FVar14.exp;
  local_50 = FVar14;
  if (((uVar10 ^ uVar9) & 0xff0000000000) == 0x10000000000) {
    if (FVar5 != float_class_normal || FVar7 != float_class_normal) {
      if (((FVar14._12_4_ | local_40._12_4_) & 0xfc) == 0) {
        if (FVar5 == float_class_zero || FVar7 == float_class_inf) goto LAB_00922581;
        if (FVar7 != float_class_zero && FVar5 != float_class_inf) {
LAB_009225e5:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                     ,0x428,(char *)0x0);
        }
LAB_009225d2:
        local_40.sign = (_Bool)bVar11;
        FVar4 = local_40;
        FVar14.exp = local_40.exp;
        FVar14.cls = local_40.cls;
        FVar14.sign = local_40.sign;
        FVar14._14_2_ = local_40._14_2_;
        FVar14.frac = a_00;
        local_40 = FVar4;
        goto LAB_00922581;
      }
LAB_009224b5:
      FVar14 = pick_nan(FVar14,local_40,status);
      goto LAB_00922581;
    }
    if (iVar13 - iVar8 == 0 || iVar13 < iVar8) {
      if (iVar13 < iVar8) {
        shift64RightJamming(uVar12,iVar8 - iVar13,&local_50.frac);
        local_50.exp = iVar8;
        auVar2._8_8_ = uVar10 & 0xffffffff;
        auVar2._0_8_ = local_50.frac;
        auVar3 = auVar2._0_12_;
      }
    }
    else {
      shift64RightJamming(a_00,iVar13 - iVar8,&local_40.frac);
      a_00 = local_40.frac;
    }
    uVar12 = auVar3._0_8_ + a_00;
    if ((long)uVar12 < 0) {
      uVar12 = (ulong)((uint)uVar12 & 1) | uVar12 >> 1;
      local_50.exp = auVar3._8_4_ + 1;
    }
  }
  else if (FVar5 == float_class_normal && FVar7 == float_class_normal) {
    count = iVar13 - iVar8;
    if ((count != 0 && iVar8 <= iVar13) || (a_00 <= uVar12 && count == 0)) {
      shift64RightJamming(a_00,count,&local_40.frac);
      uVar12 = uVar12 - local_40.frac;
    }
    else {
      shift64RightJamming(uVar12,iVar8 - iVar13,&local_50.frac);
      uVar12 = a_00 - local_50.frac;
      local_50.exp = iVar8;
      bVar11 = bVar11 ^ 1;
      uVar9 = uVar10 & 0xffffffff;
    }
    if (uVar12 == 0) {
      local_50.cls = 1;
      bVar11 = status->float_rounding_mode == '\x01';
      uVar12 = 0;
    }
    else {
      lVar1 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      iVar8 = ((uint)lVar1 ^ 0x3f) - 1;
      uVar12 = uVar12 << ((byte)iVar8 & 0x3f);
      local_50.exp = (int)uVar9 - iVar8;
    }
    local_50.sign = (_Bool)bVar11;
  }
  else {
    if (((FVar14._12_4_ | local_40._12_4_) & 0xfc) != 0) goto LAB_009224b5;
    if (FVar7 == float_class_inf) {
      if (FVar5 == float_class_inf) {
        status->float_exception_flags = status->float_exception_flags | 1;
        FVar14.exp = 0x7fffffff;
        FVar14.cls = float_class_qnan;
        FVar14.sign = false;
        FVar14._14_2_ = 0;
        FVar14.frac = 0x2000000000000000;
      }
      goto LAB_00922581;
    }
    if (FVar5 != float_class_zero || FVar7 != float_class_zero) {
      if (FVar7 != float_class_zero && FVar5 != float_class_inf) {
        if (FVar5 != float_class_zero) goto LAB_009225e5;
        goto LAB_00922581;
      }
      bVar11 = bVar11 ^ 1;
      goto LAB_009225d2;
    }
    local_50._14_2_ = FVar14._14_2_;
    local_50._0_13_ = FVar14._0_13_;
    local_50.sign = status->float_rounding_mode == '\x01';
  }
  FVar4 = local_50;
  FVar14.exp = local_50.exp;
  FVar14.cls = local_50.cls;
  FVar14.sign = local_50.sign;
  FVar14._14_2_ = local_50._14_2_;
  FVar14.frac = uVar12;
  local_50 = FVar4;
LAB_00922581:
  fVar6 = float16a_round_pack_canonical(FVar14,status,&float16_params);
  return fVar6;
}

Assistant:

float16 QEMU_FLATTEN float16_sub(float16 a, float16 b, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pr = addsub_floats(pa, pb, true, status);

    return float16_round_pack_canonical(pr, status);
}